

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O2

void denseGETRS(realtype **a,sunindextype n,sunindextype *p,realtype *b)

{
  realtype rVar1;
  realtype *prVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar3 = 0;
  lVar4 = 0;
  if (0 < n) {
    lVar4 = n;
  }
  for (; lVar4 != lVar3; lVar3 = lVar3 + 1) {
    lVar6 = p[lVar3];
    if (lVar3 != lVar6) {
      rVar1 = b[lVar3];
      b[lVar3] = b[lVar6];
      b[lVar6] = rVar1;
    }
  }
  lVar4 = n + -1;
  lVar3 = 0;
  lVar6 = 0;
  if (0 < lVar4) {
    lVar6 = lVar4;
  }
  while (lVar5 = lVar3, lVar5 != lVar6) {
    prVar2 = a[lVar5];
    for (lVar7 = lVar5 + 1; lVar3 = lVar5 + 1, lVar7 < n; lVar7 = lVar7 + 1) {
      b[lVar7] = b[lVar7] - prVar2[lVar7] * b[lVar5];
    }
  }
  for (; 0 < lVar4; lVar4 = lVar4 + -1) {
    prVar2 = a[lVar4];
    b[lVar4] = b[lVar4] / prVar2[lVar4];
    for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      b[lVar3] = b[lVar3] - prVar2[lVar3] * b[lVar4];
    }
  }
  *b = *b / **a;
  return;
}

Assistant:

void denseGETRS(realtype **a, sunindextype n, sunindextype *p, realtype *b)
{
  sunindextype i, k, pk;
  realtype *col_k, tmp;

  /* Permute b, based on pivot information in p */
  for (k=0; k<n; k++) {
    pk = p[k];
    if(pk != k) {
      tmp = b[k];
      b[k] = b[pk];
      b[pk] = tmp;
    }
  }

  /* Solve Ly = b, store solution y in b */
  for (k=0; k<n-1; k++) {
    col_k = a[k];
    for (i=k+1; i<n; i++) b[i] -= col_k[i]*b[k];
  }

  /* Solve Ux = y, store solution x in b */
  for (k = n-1; k > 0; k--) {
    col_k = a[k];
    b[k] /= col_k[k];
    for (i=0; i<k; i++) b[i] -= col_k[i]*b[k];
  }
  b[0] /= a[0][0];

}